

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void av1_first_pass_row(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,int unit_row,
                       BLOCK_SIZE fp_block_size)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint raw_motion_err_counts_00;
  uint this_intra_error_00;
  int iVar6;
  int iVar7;
  int src_yoffset_00;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ThreadData_conflict *td_00;
  YV12_BUFFER_CONFIG *last_frame_00;
  YV12_BUFFER_CONFIG *golden_frame_00;
  long lVar13;
  long lVar14;
  int in_ECX;
  TileInfo *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  BLOCK_SIZE in_R8B;
  int this_inter_error;
  int this_intra_error;
  _Bool firstpass_mt_exit;
  int unit_col;
  int unit_col_in_tile;
  int recon_uvoffset;
  int src_yoffset;
  int recon_yoffset;
  MV last_mv;
  MV best_ref_mv;
  int uv_mb_height;
  int recon_uv_stride;
  int recon_y_stride;
  int src_y_stride;
  int i;
  MV *first_top_mv;
  int *raw_motion_err_list;
  FRAME_STATS *mb_stats;
  PICK_MODE_CONTEXT *ctx;
  YV12_BUFFER_CONFIG *this_frame;
  YV12_BUFFER_CONFIG *golden_frame;
  YV12_BUFFER_CONFIG *last_frame;
  AV1EncRowMultiThreadSync *row_mt_sync;
  AV1EncRowMultiThreadInfo *enc_row_mt;
  MultiThreadInfo *mt_info;
  int unit_cols_in_tile;
  int unit_col_start;
  int unit_row_in_tile;
  int raw_motion_err_counts;
  int unit_cols;
  int unit_height_log2;
  int unit_width_log2;
  int unit_width;
  int fp_block_size_height;
  int fp_block_size_width;
  int qindex;
  TileInfo *tile;
  MACROBLOCKD *xd;
  int num_planes;
  SequenceHeader *seq_params;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  MACROBLOCK *x;
  int in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe80;
  BLOCK_SIZE bsize;
  int in_stack_fffffffffffffe84;
  undefined8 in_stack_fffffffffffffe88;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffe90;
  MACROBLOCK *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  int iVar15;
  int in_stack_fffffffffffffedc;
  undefined1 local_120 [4];
  int local_11c;
  int local_118;
  int local_114;
  int local_10c;
  int *piVar16;
  FRAME_STATS *stats;
  AV1_COMP *cpi_00;
  long *plVar17;
  int in_stack_ffffffffffffff48;
  int iVar18;
  TileInfo *tile_00;
  MV *best_mv;
  undefined4 in_stack_ffffffffffffff88;
  FRAME_STATS *stats_00;
  
  bsize = (BLOCK_SIZE)((uint)in_stack_fffffffffffffe80 >> 0x18);
  stats_00 = (FRAME_STATS *)in_RDI[0x8401];
  iVar2 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x77f0));
  best_mv = (MV *)(in_RSI + 0x34);
  tile_00 = in_RDX;
  iVar3 = find_fp_qindex(0);
  uVar4 = (uint)block_size_high[in_R8B];
  uVar5 = (uint)block_size_wide[in_R8B];
  raw_motion_err_counts_00 =
       (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R8B];
  this_intra_error_00 = (uint)""[in_R8B];
  iVar6 = (*(int *)((long)in_RDI + 0x3c18c) << 2) / (int)raw_motion_err_counts_00;
  iVar18 = 0;
  iVar7 = in_ECX - (tile_00->mi_row_start >> (""[in_R8B] & 0x1f));
  src_yoffset_00 = tile_00->mi_col_start >> (""[in_R8B] & 0x1f);
  iVar8 = av1_get_unit_cols_in_tile(tile_00,in_R8B);
  plVar17 = in_RDI + 0x135c9;
  cpi_00 = (AV1_COMP *)&in_RDX[0x3de].mi_col_start;
  td_00 = (ThreadData_conflict *)
          av1_get_scaled_ref_frame
                    ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe5c);
  if (td_00 == (ThreadData_conflict *)0x0) {
    td_00 = (ThreadData_conflict *)
            get_ref_frame_yv12_buf
                      ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (MV_REFERENCE_FRAME)((uint)in_stack_fffffffffffffe5c >> 0x18));
  }
  last_frame_00 =
       av1_get_scaled_ref_frame
                 ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                  in_stack_fffffffffffffe5c);
  if (last_frame_00 == (YV12_BUFFER_CONFIG *)0x0) {
    last_frame_00 =
         get_ref_frame_yv12_buf
                   ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                    (MV_REFERENCE_FRAME)((uint)in_stack_fffffffffffffe5c >> 0x18));
  }
  lVar1 = in_RDI[0x780d];
  golden_frame_00 = (YV12_BUFFER_CONFIG *)(lVar1 + 0x4e0);
  stats = (FRAME_STATS *)in_RSI[0x4bb1];
  lVar13 = in_RDI[0x13a9a] + (long)(in_ECX * iVar6) * 0x78 + (long)src_yoffset_00 * 0x78;
  lVar14 = in_RDI[0x13a9b] + (long)(in_ECX * iVar6) * 4 + (long)src_yoffset_00 * 4;
  piVar16 = &in_RDX[0x3e0].mi_col_start;
  for (local_10c = 0; local_10c < iVar2; local_10c = local_10c + 1) {
    in_RSI[(long)local_10c * 0x11 + 3] = (&stats[2].neutral_count)[local_10c];
    in_RSI[(long)local_10c * 0x11 + 2] = *(undefined8 *)(&stats[2].sum_mvr + (long)local_10c * 2);
    in_RSI[(long)local_10c * 0x11 + 4] = (&stats[3].intra_error)[local_10c];
    in_RSI[(long)local_10c * 0x11 + 5] = (&stats[3].sr_coded_error)[local_10c];
    in_RSI[(long)local_10c * 0x11 + 1] = (&stats[2].sum_mvcs)[local_10c];
  }
  iVar6 = *(int *)(in_RDI[0x84f5] + 0x20);
  local_114 = *(int *)(lVar1 + 0x500);
  local_118 = *(int *)(lVar1 + 0x504);
  local_11c = (int)uVar5 >> (*(int *)(lVar1 + 0x4ec) < *(int *)(lVar1 + 0x4e8));
  memset(local_120,0,4);
  *(bool *)&best_mv[0x7b0].row = iVar7 != 0;
  iVar9 = in_ECX * local_114 * uVar5 + src_yoffset_00 * uVar4;
  iVar10 = in_ECX * iVar6 * uVar5 + src_yoffset_00 * uVar4;
  iVar11 = in_ECX * local_118 * local_11c + src_yoffset_00 * local_11c;
  av1_set_mv_row_limits
            ((CommonModeInfoParams *)(in_RDI + 0x7831),(FullMvLimits *)((long)in_RSI + 0x1f6e4),
             in_ECX << ((byte)this_intra_error_00 & 0x1f),(int)uVar5 >> 2,
             *(int *)((long)in_RDI + 0x42724));
  av1_setup_src_planes
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
             (int)((ulong)in_stack_fffffffffffffe88 >> 0x20),(int)in_stack_fffffffffffffe88,
             in_stack_fffffffffffffe84,bsize);
  memset((void *)*in_RSI,0,0x200);
  iVar15 = 0;
  do {
    if (iVar8 <= iVar15) {
      return;
    }
    iVar12 = src_yoffset_00 + iVar15;
    (*(code *)in_RDI[0x135f9])(cpi_00,iVar7,iVar15);
    if (1 < *(int *)(*in_RDI + 0x123d0)) {
      pthread_mutex_lock((pthread_mutex_t *)in_RDI[0x135f7]);
      in_stack_fffffffffffffec4 =
           CONCAT13(*(undefined1 *)((long)in_RDI + 0x9afb5),(int3)in_stack_fffffffffffffec4) &
           0x1ffffff;
      pthread_mutex_unlock((pthread_mutex_t *)in_RDI[0x135f7]);
      if ((in_stack_fffffffffffffec4 & 0x1000000) != 0) {
        return;
      }
    }
    if (iVar15 == 0) {
      in_stack_fffffffffffffedc = *piVar16;
    }
    in_stack_fffffffffffffec0 =
         firstpass_intra_prediction
                   ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffedc,iVar9),
                    (ThreadData_conflict *)CONCAT44(iVar10,iVar11),
                    (YV12_BUFFER_CONFIG *)CONCAT44(iVar15,iVar12),
                    (TileInfo *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,iVar6,(int)piVar16,
                    (BLOCK_SIZE)lVar14,(int)lVar13,stats);
    iVar12 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
    if (iVar12 == 0) {
      in_stack_fffffffffffffebc =
           firstpass_inter_prediction
                     (cpi_00,td_00,last_frame_00,golden_frame_00,(int)((ulong)stats >> 0x20),
                      (int)stats,(int)plVar17,in_stack_ffffffffffffff48,src_yoffset_00,
                      (BLOCK_SIZE)iVar18,this_intra_error_00,raw_motion_err_counts_00,
                      (int *)CONCAT44(iVar3,uVar4),SUB84(tile_00,0),best_mv,
                      (MV *)CONCAT44(iVar2,in_stack_ffffffffffffff88),stats_00);
      if (iVar15 == 0) {
        *piVar16 = in_stack_fffffffffffffedc;
      }
      *(long *)(lVar13 + 0x10) = (long)in_stack_fffffffffffffebc + *(long *)(lVar13 + 0x10);
      iVar18 = iVar18 + 1;
    }
    else {
      *(long *)(lVar13 + 0x18) = (long)in_stack_fffffffffffffec0 + *(long *)(lVar13 + 0x18);
      *(long *)(lVar13 + 0x10) = (long)in_stack_fffffffffffffec0 + *(long *)(lVar13 + 0x10);
    }
    in_RSI[6] = in_RSI[6] + (long)(int)uVar4;
    if (1 < iVar2) {
      in_RSI[0x17] = in_RSI[0x17] + (long)local_11c;
      in_RSI[0x28] = in_RSI[0x28] + (long)local_11c;
    }
    iVar9 = uVar4 + iVar9;
    iVar10 = uVar4 + iVar10;
    iVar11 = local_11c + iVar11;
    lVar13 = lVar13 + 0x78;
    (*(code *)in_RDI[0x135fa])(cpi_00,iVar7,iVar15,iVar8);
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

void av1_first_pass_row(AV1_COMP *cpi, ThreadData *td, TileDataEnc *tile_data,
                        const int unit_row, const BLOCK_SIZE fp_block_size) {
  MACROBLOCK *const x = &td->mb;
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  TileInfo *tile = &tile_data->tile_info;
  const int qindex = find_fp_qindex(seq_params->bit_depth);
  const int fp_block_size_width = block_size_high[fp_block_size];
  const int fp_block_size_height = block_size_wide[fp_block_size];
  const int unit_width = mi_size_wide[fp_block_size];
  const int unit_width_log2 = mi_size_wide_log2[fp_block_size];
  const int unit_height_log2 = mi_size_high_log2[fp_block_size];
  const int unit_cols = mi_params->mb_cols * 4 / unit_width;
  int raw_motion_err_counts = 0;
  int unit_row_in_tile = unit_row - (tile->mi_row_start >> unit_height_log2);
  int unit_col_start = tile->mi_col_start >> unit_width_log2;
  int unit_cols_in_tile = av1_get_unit_cols_in_tile(tile, fp_block_size);
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  AV1EncRowMultiThreadSync *const row_mt_sync = &tile_data->row_mt_sync;

  const YV12_BUFFER_CONFIG *last_frame =
      av1_get_scaled_ref_frame(cpi, LAST_FRAME);
  if (!last_frame) {
    last_frame = get_ref_frame_yv12_buf(cm, LAST_FRAME);
  }
  const YV12_BUFFER_CONFIG *golden_frame =
      av1_get_scaled_ref_frame(cpi, GOLDEN_FRAME);
  if (!golden_frame) {
    golden_frame = get_ref_frame_yv12_buf(cm, GOLDEN_FRAME);
  }
  YV12_BUFFER_CONFIG *const this_frame = &cm->cur_frame->buf;

  PICK_MODE_CONTEXT *ctx = td->firstpass_ctx;
  FRAME_STATS *mb_stats =
      cpi->firstpass_data.mb_stats + unit_row * unit_cols + unit_col_start;
  int *raw_motion_err_list = cpi->firstpass_data.raw_motion_err_list +
                             unit_row * unit_cols + unit_col_start;
  MV *first_top_mv = &tile_data->firstpass_top_mv;

  for (int i = 0; i < num_planes; ++i) {
    x->plane[i].coeff = ctx->coeff[i];
    x->plane[i].qcoeff = ctx->qcoeff[i];
    x->plane[i].eobs = ctx->eobs[i];
    x->plane[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
    x->plane[i].dqcoeff = ctx->dqcoeff[i];
  }

  const int src_y_stride = cpi->source->y_stride;
  const int recon_y_stride = this_frame->y_stride;
  const int recon_uv_stride = this_frame->uv_stride;
  const int uv_mb_height =
      fp_block_size_height >> (this_frame->y_height > this_frame->uv_height);

  MV best_ref_mv = kZeroMv;
  MV last_mv;

  // Reset above block coeffs.
  xd->up_available = (unit_row_in_tile != 0);
  int recon_yoffset = (unit_row * recon_y_stride * fp_block_size_height) +
                      (unit_col_start * fp_block_size_width);
  int src_yoffset = (unit_row * src_y_stride * fp_block_size_height) +
                    (unit_col_start * fp_block_size_width);
  int recon_uvoffset = (unit_row * recon_uv_stride * uv_mb_height) +
                       (unit_col_start * uv_mb_height);

  // Set up limit values for motion vectors to prevent them extending
  // outside the UMV borders.
  av1_set_mv_row_limits(
      mi_params, &x->mv_limits, (unit_row << unit_height_log2),
      (fp_block_size_height >> MI_SIZE_LOG2), cpi->oxcf.border_in_pixels);

  av1_setup_src_planes(x, cpi->source, unit_row << unit_height_log2,
                       tile->mi_col_start, num_planes, fp_block_size);

  // Fix - zero the 16x16 block first. This ensures correct this_intra_error for
  // block sizes smaller than 16x16.
  av1_zero_array(x->plane[0].src_diff, 256);

  for (int unit_col_in_tile = 0; unit_col_in_tile < unit_cols_in_tile;
       unit_col_in_tile++) {
    const int unit_col = unit_col_start + unit_col_in_tile;

    enc_row_mt->sync_read_ptr(row_mt_sync, unit_row_in_tile, unit_col_in_tile);

#if CONFIG_MULTITHREAD
    if (cpi->ppi->p_mt_info.num_workers > 1) {
      pthread_mutex_lock(enc_row_mt->mutex_);
      bool firstpass_mt_exit = enc_row_mt->firstpass_mt_exit;
      pthread_mutex_unlock(enc_row_mt->mutex_);
      // Exit in case any worker has encountered an error.
      if (firstpass_mt_exit) return;
    }
#endif

    if (unit_col_in_tile == 0) {
      last_mv = *first_top_mv;
    }
    int this_intra_error = firstpass_intra_prediction(
        cpi, td, this_frame, tile, unit_row, unit_col, recon_yoffset,
        recon_uvoffset, fp_block_size, qindex, mb_stats);

    if (!frame_is_intra_only(cm)) {
      const int this_inter_error = firstpass_inter_prediction(
          cpi, td, last_frame, golden_frame, unit_row, unit_col, recon_yoffset,
          recon_uvoffset, src_yoffset, fp_block_size, this_intra_error,
          raw_motion_err_counts, raw_motion_err_list, best_ref_mv, &best_ref_mv,
          &last_mv, mb_stats);
      if (unit_col_in_tile == 0) {
        *first_top_mv = last_mv;
      }
      mb_stats->coded_error += this_inter_error;
      ++raw_motion_err_counts;
    } else {
      mb_stats->sr_coded_error += this_intra_error;
      mb_stats->coded_error += this_intra_error;
    }

    // Adjust to the next column of MBs.
    x->plane[0].src.buf += fp_block_size_width;
    if (num_planes > 1) {
      x->plane[1].src.buf += uv_mb_height;
      x->plane[2].src.buf += uv_mb_height;
    }

    recon_yoffset += fp_block_size_width;
    src_yoffset += fp_block_size_width;
    recon_uvoffset += uv_mb_height;
    mb_stats++;

    enc_row_mt->sync_write_ptr(row_mt_sync, unit_row_in_tile, unit_col_in_tile,
                               unit_cols_in_tile);
  }
}